

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * get_array1(char **content,size_t *line_no,int *arr,int size)

{
  long lVar1;
  char *line_00;
  double dVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  char local_68 [8];
  char buf [16];
  char *line;
  int last;
  int r;
  int pp;
  int pos;
  int p;
  int i;
  int size_local;
  int *arr_local;
  size_t *line_no_local;
  char **content_local;
  
  line._4_4_ = 0;
  pos = 0;
  p = size;
  _i = arr;
  arr_local = (int *)line_no;
  line_no_local = (size_t *)content;
  do {
    if (p <= pos) {
      return (char *)0x0;
    }
    lVar1 = *(long *)arr_local;
    *(long *)arr_local = lVar1 + 1;
    line_00 = (char *)line_no_local[lVar1];
    if (line_00 == (char *)0x0) {
      vrna_message_error("unexpected end of file in get_array1");
    }
    ignore_comment(line_00);
    r = 0;
    while( true ) {
      bVar4 = false;
      if (pos < p) {
        iVar3 = __isoc99_sscanf(line_00 + r,"%15s%n",local_68,&last);
        bVar4 = iVar3 == 1;
      }
      if (!bVar4) break;
      r = last + r;
      if (local_68[0] == '*') {
        pos = pos + 1;
      }
      else {
        if (local_68[0] == 'x') {
          if (pos == 0) {
            vrna_message_error("can\'t extrapolate first value");
          }
          dVar2 = lxc37;
          iVar3 = _i[line._4_4_];
          dVar5 = log((double)pos / (double)line._4_4_);
          pp = iVar3 + (int)(dVar2 * dVar5 + 0.5);
        }
        else {
          iVar3 = strcmp(local_68,"DEF");
          if (iVar3 == 0) {
            pp = -0x32;
          }
          else {
            iVar3 = strcmp(local_68,"INF");
            if (iVar3 == 0) {
              pp = 10000000;
            }
            else {
              iVar3 = strcmp(local_68,"NST");
              if (iVar3 == 0) {
                pp = 0;
              }
              else {
                iVar3 = __isoc99_sscanf(local_68,"%d",&pp);
                if (iVar3 != 1) {
                  return line_00 + r;
                }
                line._4_4_ = pos;
              }
            }
          }
        }
        _i[pos] = pp;
        pos = pos + 1;
      }
    }
  } while( true );
}

Assistant:

PRIVATE char *
get_array1(char   **content,
           size_t *line_no,
           int    *arr,
           int    size)
{
  int   i, p, pos, pp, r, last;
  char  *line, buf[16];


  i = last = 0;
  while (i < size) {
    line = content[(*line_no)++];
    if (!line)
      vrna_message_error("unexpected end of file in get_array1");

    ignore_comment(line);
    pos = 0;
    while ((i < size) && (sscanf(line + pos, "%15s%n", buf, &pp) == 1)) {
      pos += pp;
      if (buf[0] == '*') {
        i++;
        continue;
      } else if (buf[0] == 'x') {
        /* should only be used for loop parameters */
        if (i == 0)
          vrna_message_error("can't extrapolate first value");

        p = arr[last] + (int)(0.5 + lxc37 * log(((double)i) / (double)(last)));
      } else if (strcmp(buf, "DEF") == 0) {
        p = DEF;
      } else if (strcmp(buf, "INF") == 0) {
        p = INF;
      } else if (strcmp(buf, "NST") == 0) {
        p = NST;
      } else {
        r = sscanf(buf, "%d", &p);
        if (r != 1) {
          return line + pos;
          vrna_message_error("can't interpret `%s' in get_array1", buf);
          exit(1);
        }

        last = i;
      }

      arr[i++] = p;
    }
  }

  return NULL;
}